

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

void twice_cb(uv_timer_t *handle)

{
  int iVar1;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uv_loop_t *loop;
  undefined8 *puVar4;
  code **ppcVar5;
  uv_timer_t *puVar6;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t uStack_368;
  uv_loop_t *puStack_2f0;
  code *pcStack_2e8;
  void *pvStack_2e0;
  undefined1 auStack_2d8 [16];
  undefined8 uStack_2c8;
  uv__queue *puStack_2c0;
  undefined1 auStack_2b8 [24];
  uv_close_cb p_Stack_2a0;
  uv_loop_t *puStack_298;
  undefined8 uStack_288;
  undefined1 auStack_280 [8];
  uv_timer_t uStack_278;
  uv_loop_t *puStack_200;
  uv__queue *puStack_1f0;
  uv__queue *puStack_1e8;
  undefined1 auStack_1d8 [8];
  code *pcStack_1d0;
  undefined8 auStack_1c8 [2];
  undefined1 auStack_1b8 [8];
  uv_timer_t uStack_1b0;
  uv_timer_t uStack_138;
  uv_loop_t *puStack_c0;
  uv_timer_t uStack_98;
  uv_timer_t *puStack_20;
  uv_loop_t *local_18;
  uv__queue *local_10;
  
  puStack_20 = (uv_timer_t *)0x1d2fff;
  printf("TWICE_CB %d\n",(ulong)(uint)twice_cb_called);
  if (handle == (uv_timer_t *)0x0) {
    puStack_20 = (uv_timer_t *)0x1d3045;
    twice_cb_cold_2();
  }
  else {
    puStack_20 = (uv_timer_t *)0x1d300c;
    iVar1 = uv_is_active((uv_handle_t *)handle);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 == (uv__queue *)0x0) {
      twice_cb_called = twice_cb_called + 1;
      uv_close((uv_handle_t *)handle,twice_close_cb);
      return;
    }
  }
  puStack_20 = (uv_timer_t *)run_test_timer_init;
  twice_cb_cold_1();
  puStack_20 = handle;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_98);
  if (iVar1 == 0) {
    uVar3 = uv_timer_get_repeat(&uStack_98);
    if (uVar3 != 0) goto LAB_001d3171;
    uv_timer_get_due_in(&uStack_98);
    iVar1 = uv_is_active((uv_handle_t *)&uStack_98);
    if (iVar1 != 0) goto LAB_001d318f;
    handle = (uv_timer_t *)uv_default_loop();
    uv_walk((uv_loop_t *)handle,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)handle,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_001d3171:
    run_test_timer_init_cold_2();
    run_test_timer_init_cold_5();
LAB_001d318f:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  puVar4 = auStack_1c8;
  auStack_1b8._4_4_ = 0;
  auStack_1b8._0_4_ = 1;
  pcStack_1d0 = (code *)0x1d31cc;
  puStack_c0 = (uv_loop_t *)handle;
  puVar2 = uv_default_loop();
  pcStack_1d0 = (code *)0x1d31dc;
  iVar1 = uv_timer_init(puVar2,&uStack_138);
  uStack_1b0.data = (void *)(long)iVar1;
  auStack_1c8[0] = 0;
  if ((uv_loop_t *)uStack_1b0.data == (uv_loop_t *)0x0) {
    pcStack_1d0 = (code *)0x1d31ff;
    puVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d320c;
    iVar1 = uv_timer_init(puVar2,&uStack_1b0);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d347c;
    handle = (uv_timer_t *)(auStack_1b8 + 4);
    pcStack_1d0 = (code *)0x1d324a;
    uStack_138.data = handle;
    iVar1 = uv_timer_start(&uStack_138,order_cb_a,0,0);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d3489;
    pcStack_1d0 = (code *)0x1d3285;
    uStack_1b0.data = (uv_loop_t *)auStack_1b8;
    iVar1 = uv_timer_start(&uStack_1b0,order_cb_b,0,0);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d3496;
    pcStack_1d0 = (code *)0x1d32a8;
    puVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d32b2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d34a3;
    auStack_1c8[0] = 2;
    auStack_1c8[1] = SEXT48(order_cb_called);
    if ((__pthread_internal_list *)auStack_1c8[1] != (__pthread_internal_list *)0x2)
    goto LAB_001d34b0;
    pcStack_1d0 = (code *)0x1d3300;
    iVar1 = uv_timer_stop(&uStack_138);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d34bd;
    pcStack_1d0 = (code *)0x1d3328;
    iVar1 = uv_timer_stop(&uStack_1b0);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d34ca;
    order_cb_called = 0;
    pcStack_1d0 = (code *)0x1d3368;
    uStack_1b0.data = handle;
    iVar1 = uv_timer_start(&uStack_1b0,order_cb_b,0,0);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d34d7;
    pcStack_1d0 = (code *)0x1d33a1;
    uStack_138.data = (uv_loop_t *)auStack_1b8;
    iVar1 = uv_timer_start(&uStack_138,order_cb_a,0,0);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d34e4;
    pcStack_1d0 = (code *)0x1d33c4;
    puVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d33ce;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_1c8[0] = SEXT48(iVar1);
    auStack_1c8[1] = (__pthread_internal_list *)0x0;
    if (auStack_1c8[0] != 0) goto LAB_001d34f1;
    auStack_1c8[0] = 2;
    auStack_1c8[1] = SEXT48(order_cb_called);
    if ((__pthread_internal_list *)auStack_1c8[1] != (__pthread_internal_list *)0x2)
    goto LAB_001d34fe;
    pcStack_1d0 = (code *)0x1d3414;
    handle = (uv_timer_t *)uv_default_loop();
    pcStack_1d0 = (code *)0x1d3428;
    uv_walk((uv_loop_t *)handle,close_walk_cb,(void *)0x0);
    pcStack_1d0 = (code *)0x1d3432;
    uv_run((uv_loop_t *)handle,UV_RUN_DEFAULT);
    auStack_1c8[0] = 0;
    pcStack_1d0 = (code *)0x1d343f;
    puVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d3447;
    iVar1 = uv_loop_close(puVar2);
    auStack_1c8[1] = SEXT48(iVar1);
    if (auStack_1c8[0] == auStack_1c8[1]) {
      pcStack_1d0 = (code *)0x1d3462;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_1d0 = (code *)0x1d347c;
    run_test_timer_order_cold_1();
LAB_001d347c:
    pcStack_1d0 = (code *)0x1d3489;
    run_test_timer_order_cold_2();
LAB_001d3489:
    pcStack_1d0 = (code *)0x1d3496;
    run_test_timer_order_cold_3();
LAB_001d3496:
    pcStack_1d0 = (code *)0x1d34a3;
    run_test_timer_order_cold_4();
LAB_001d34a3:
    pcStack_1d0 = (code *)0x1d34b0;
    run_test_timer_order_cold_5();
LAB_001d34b0:
    pcStack_1d0 = (code *)0x1d34bd;
    run_test_timer_order_cold_6();
LAB_001d34bd:
    pcStack_1d0 = (code *)0x1d34ca;
    run_test_timer_order_cold_7();
LAB_001d34ca:
    pcStack_1d0 = (code *)0x1d34d7;
    run_test_timer_order_cold_8();
LAB_001d34d7:
    pcStack_1d0 = (code *)0x1d34e4;
    run_test_timer_order_cold_9();
LAB_001d34e4:
    pcStack_1d0 = (code *)0x1d34f1;
    run_test_timer_order_cold_10();
LAB_001d34f1:
    pcStack_1d0 = (code *)0x1d34fe;
    run_test_timer_order_cold_11();
LAB_001d34fe:
    pcStack_1d0 = (code *)0x1d350b;
    run_test_timer_order_cold_12();
  }
  pcStack_1d0 = order_cb_a;
  run_test_timer_order_cold_13();
  pcStack_1d0 = (code *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  auStack_1d8 = (undefined1  [8])(long)*(int *)*puVar4;
  if ((undefined1  [8])pcStack_1d0 == auStack_1d8) {
    return;
  }
  ppcVar5 = &pcStack_1d0;
  puStack_1e8 = (uv__queue *)order_cb_b;
  order_cb_a_cold_1();
  puStack_1e8 = (uv__queue *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  puStack_1f0 = (uv__queue *)(long)*(int *)*ppcVar5;
  if (puStack_1e8 == puStack_1f0) {
    return;
  }
  puStack_200 = (uv_loop_t *)run_test_timer_zero_timeout;
  order_cb_b_cold_1();
  puStack_298 = (uv_loop_t *)0x1d35ad;
  puStack_200 = (uv_loop_t *)handle;
  puVar2 = uv_default_loop();
  puStack_298 = (uv_loop_t *)0x1d35bd;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)(auStack_280 + 8));
  auStack_280 = (undefined1  [8])(long)iVar1;
  uStack_288 = (uv_handle_t *)0x0;
  if (auStack_280 == (undefined1  [8])0x0) {
    puStack_298 = (uv_loop_t *)0x1d35f2;
    iVar1 = uv_timer_start((uv_timer_t *)(auStack_280 + 8),zero_timeout_cb,0,0);
    auStack_280 = (undefined1  [8])(long)iVar1;
    uStack_288 = (uv_handle_t *)0x0;
    if (auStack_280 != (undefined1  [8])0x0) goto LAB_001d371a;
    auStack_280 = (undefined1  [8])0x1;
    puStack_298 = (uv_loop_t *)0x1d3625;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_288 = SEXT48(iVar1);
    if (auStack_280 != (undefined1  [8])uStack_288) goto LAB_001d3729;
    auStack_280 = (undefined1  [8])0x1;
    uStack_288 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_288 != (uv_handle_t *)0x1) goto LAB_001d3738;
    puStack_298 = (uv_loop_t *)0x1d366d;
    uv_close((uv_handle_t *)(auStack_280 + 8),(uv_close_cb)0x0);
    puStack_298 = (uv_loop_t *)0x1d3677;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_280 = (undefined1  [8])(long)iVar1;
    uStack_288 = (uv_handle_t *)0x0;
    if (auStack_280 != (undefined1  [8])0x0) goto LAB_001d3747;
    auStack_280 = (undefined1  [8])0x1;
    uStack_288 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_288 != (uv_handle_t *)0x1) goto LAB_001d3756;
    puStack_298 = (uv_loop_t *)0x1d36cd;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    puStack_298 = (uv_loop_t *)0x1d36d7;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_280 = (undefined1  [8])0x0;
    puStack_298 = (uv_loop_t *)0x1d36e8;
    iVar1 = uv_loop_close(puVar2);
    uStack_288 = SEXT48(iVar1);
    if (auStack_280 == (undefined1  [8])uStack_288) {
      puStack_298 = (uv_loop_t *)0x1d3700;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_298 = (uv_loop_t *)0x1d371a;
    run_test_timer_zero_timeout_cold_1();
LAB_001d371a:
    puStack_298 = (uv_loop_t *)0x1d3729;
    run_test_timer_zero_timeout_cold_2();
LAB_001d3729:
    puStack_298 = (uv_loop_t *)0x1d3738;
    run_test_timer_zero_timeout_cold_3();
LAB_001d3738:
    puStack_298 = (uv_loop_t *)0x1d3747;
    run_test_timer_zero_timeout_cold_4();
LAB_001d3747:
    puStack_298 = (uv_loop_t *)0x1d3756;
    run_test_timer_zero_timeout_cold_5();
LAB_001d3756:
    puStack_298 = (uv_loop_t *)0x1d3765;
    run_test_timer_zero_timeout_cold_6();
  }
  loop = (uv_loop_t *)auStack_280;
  puStack_298 = (uv_loop_t *)zero_timeout_cb;
  run_test_timer_zero_timeout_cold_7();
  auStack_2b8._8_8_ = (uv_loop_t *)0x1d378c;
  puStack_298 = puVar2;
  iVar1 = uv_timer_start((uv_timer_t *)loop,zero_timeout_cb,0,0);
  p_Stack_2a0 = (uv_close_cb)(long)iVar1;
  auStack_2b8._16_8_ = (uv_handle_t *)0x0;
  if (p_Stack_2a0 == (uv_close_cb)0x0) {
    auStack_2b8._8_8_ = (uv_loop_t *)0x1d37af;
    uv_stop(*(uv_loop_t **)&loop->active_handles);
    zero_timeout_cb_calls = zero_timeout_cb_calls + 1;
    return;
  }
  auStack_2b8._8_8_ = run_test_timer_huge_timeout;
  zero_timeout_cb_cold_1();
  uStack_2c8._0_4_ = 0x1d37d2;
  uStack_2c8._4_4_ = 0;
  auStack_2b8._8_8_ = loop;
  puVar2 = uv_default_loop();
  uStack_2c8._0_4_ = 0x1d37e1;
  uStack_2c8._4_4_ = 0;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  auStack_2b8._0_8_ = SEXT48(iVar1);
  puStack_2c0 = (uv__queue *)0x0;
  if ((uv__queue *)auStack_2b8._0_8_ == (uv__queue *)0x0) {
    uStack_2c8._0_4_ = 0x1d3804;
    uStack_2c8._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d3813;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d3a1e;
    uStack_2c8._0_4_ = 0x1d3836;
    uStack_2c8._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d3845;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_init(puVar2,&huge_timer2);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d3a2b;
    uStack_2c8._0_4_ = 0x1d387d;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d3a38;
    loop = (uv_loop_t *)0xffffffffffff;
    uStack_2c8._0_4_ = 0x1d38bd;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d3a45;
    uStack_2c8._0_4_ = 0x1d38f7;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d3a52;
    auStack_2b8._0_8_ = (uv__queue *)0x1;
    uStack_2c8._0_4_ = 0x1d392a;
    uStack_2c8._4_4_ = 0;
    puStack_2c0 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if ((uv__queue *)auStack_2b8._0_8_ != puStack_2c0) goto LAB_001d3a5f;
    auStack_2b8._0_8_ = (uv__queue *)0xffffffffffff;
    uStack_2c8._0_4_ = 0x1d394e;
    uStack_2c8._4_4_ = 0;
    puStack_2c0 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if ((uv__queue *)auStack_2b8._0_8_ != puStack_2c0) goto LAB_001d3a6c;
    auStack_2b8._0_8_ = (uv__queue *)0x0;
    uStack_2c8._0_4_ = 0x1d3976;
    uStack_2c8._4_4_ = 0;
    puStack_2c0 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (puStack_2c0 < (ulong)auStack_2b8._0_8_) goto LAB_001d3a79;
    uStack_2c8._0_4_ = 0x1d398e;
    uStack_2c8._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d3998;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d3a86;
    uStack_2c8._0_4_ = 0x1d39bb;
    uStack_2c8._4_4_ = 0;
    loop = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d39cf;
    uStack_2c8._4_4_ = 0;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uStack_2c8._0_4_ = 0x1d39d9;
    uStack_2c8._4_4_ = 0;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_2b8._0_8_ = (uv__queue *)0x0;
    uStack_2c8._0_4_ = 0x1d39e7;
    uStack_2c8._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d39ef;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_loop_close(puVar2);
    puStack_2c0 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)auStack_2b8._0_8_ == puStack_2c0) {
      uStack_2c8._0_4_ = 0x1d3a09;
      uStack_2c8._4_4_ = 0;
      uv_library_shutdown();
      return;
    }
  }
  else {
    uStack_2c8._0_4_ = 0x1d3a1e;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d3a1e:
    uStack_2c8._0_4_ = 0x1d3a2b;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d3a2b:
    uStack_2c8._0_4_ = 0x1d3a38;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d3a38:
    uStack_2c8._0_4_ = 0x1d3a45;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d3a45:
    uStack_2c8._0_4_ = 0x1d3a52;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d3a52:
    uStack_2c8._0_4_ = 0x1d3a5f;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d3a5f:
    uStack_2c8._0_4_ = 0x1d3a6c;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d3a6c:
    uStack_2c8._0_4_ = 0x1d3a79;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d3a79:
    uStack_2c8._0_4_ = 0x1d3a86;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d3a86:
    uStack_2c8._0_4_ = 0x1d3a93;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar6 = (uv_timer_t *)auStack_2b8;
  uStack_2c8 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar6 == &tiny_timer) {
    auStack_2d8._8_8_ = (uv_loop_t *)0x1d3abb;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    auStack_2d8._8_8_ = (uv_loop_t *)0x1d3ac9;
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer2,(uv_close_cb)0x0);
    return;
  }
  auStack_2d8._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_2e8 = (code *)0x1d3ae7;
  auStack_2d8._8_8_ = loop;
  puVar2 = uv_default_loop();
  pcStack_2e8 = (code *)0x1d3af6;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  auStack_2d8._0_8_ = SEXT48(iVar1);
  pvStack_2e0 = (void *)0x0;
  if ((void *)auStack_2d8._0_8_ == (void *)0x0) {
    pcStack_2e8 = (code *)0x1d3b19;
    puVar2 = uv_default_loop();
    pcStack_2e8 = (code *)0x1d3b28;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d3c4f;
    pcStack_2e8 = (code *)0x1d3b63;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d3c5c;
    pcStack_2e8 = (code *)0x1d3ba0;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d3c69;
    pcStack_2e8 = (code *)0x1d3bc3;
    puVar2 = uv_default_loop();
    pcStack_2e8 = (code *)0x1d3bcd;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d3c76;
    pcStack_2e8 = (code *)0x1d3bf0;
    loop = uv_default_loop();
    pcStack_2e8 = (code *)0x1d3c04;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_2e8 = (code *)0x1d3c0e;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_2d8._0_8_ = (void *)0x0;
    pcStack_2e8 = (code *)0x1d3c1c;
    puVar2 = uv_default_loop();
    pcStack_2e8 = (code *)0x1d3c24;
    iVar1 = uv_loop_close(puVar2);
    pvStack_2e0 = (void *)(long)iVar1;
    if ((void *)auStack_2d8._0_8_ == pvStack_2e0) {
      pcStack_2e8 = (code *)0x1d3c3a;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_2e8 = (code *)0x1d3c4f;
    run_test_timer_huge_repeat_cold_1();
LAB_001d3c4f:
    pcStack_2e8 = (code *)0x1d3c5c;
    run_test_timer_huge_repeat_cold_2();
LAB_001d3c5c:
    pcStack_2e8 = (code *)0x1d3c69;
    run_test_timer_huge_repeat_cold_3();
LAB_001d3c69:
    pcStack_2e8 = (code *)0x1d3c76;
    run_test_timer_huge_repeat_cold_4();
LAB_001d3c76:
    pcStack_2e8 = (code *)0x1d3c83;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar6 = (uv_timer_t *)auStack_2d8;
  pcStack_2e8 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (puVar6 == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return;
    }
  }
  else {
    if (puVar6 == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return;
      }
      puStack_2f0 = (uv_loop_t *)0x1d3cc2;
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return;
    }
    puStack_2f0 = (uv_loop_t *)0x1d3cee;
    huge_repeat_cb_cold_1();
  }
  puStack_2f0 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_2f0 = loop;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_368);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_368,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d3ef3;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001d3f02;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d3f11;
    iVar1 = uv_timer_start(&uStack_368,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d3f20;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001d3f2f;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d3f3e;
    uv_close((uv_handle_t *)&uStack_368,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001d3f5c;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d3ef3:
    run_test_timer_run_once_cold_2();
LAB_001d3f02:
    run_test_timer_run_once_cold_3();
LAB_001d3f11:
    run_test_timer_run_once_cold_4();
LAB_001d3f20:
    run_test_timer_run_once_cold_5();
LAB_001d3f2f:
    run_test_timer_run_once_cold_6();
LAB_001d3f3e:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d3f5c:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return;
}

Assistant:

static void twice_cb(uv_timer_t* handle) {
  printf("TWICE_CB %d\n", twice_cb_called);

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active((uv_handle_t*) handle));

  twice_cb_called++;

  uv_close((uv_handle_t*)handle, twice_close_cb);
}